

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointMotor.cpp
# Opt level: O1

void __thiscall btMultiBodyJointMotor::finalizeMultiDof(btMultiBodyJointMotor *this)

{
  btMultiBodyConstraint::allocateJacobiansMultiDof(&this->super_btMultiBodyConstraint);
  (this->super_btMultiBodyConstraint).m_data.m_data
  [(long)(this->super_btMultiBodyConstraint).m_numRows +
   (ulong)((((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
           [(this->super_btMultiBodyConstraint).m_linkA].m_dofOffset + 6)] = 1.0;
  (this->super_btMultiBodyConstraint).m_numDofsFinalized =
       (this->super_btMultiBodyConstraint).m_jacSizeBoth;
  return;
}

Assistant:

void btMultiBodyJointMotor::finalizeMultiDof()
{
	allocateJacobiansMultiDof();
	// note: we rely on the fact that data.m_jacobians are
	// always initialized to zero by the Constraint ctor
	int linkDoF = 0;
	unsigned int offset = 6 + (m_bodyA->getLink(m_linkA).m_dofOffset + linkDoF);

	// row 0: the lower bound
	// row 0: the lower bound
	jacobianA(0)[offset] = 1;

	m_numDofsFinalized = m_jacSizeBoth;
}